

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::ForStatement(SQCompiler *this)

{
  SQInteger SVar1;
  SQInteger SVar2;
  SQFuncState *pSVar3;
  long lVar4;
  SQInteger SVar5;
  SQInteger SVar6;
  SQInteger SVar7;
  SQInstruction *pSVar8;
  ulong uVar9;
  SQUnsignedInteger SVar10;
  SQInteger oldouters;
  SQInteger i_1;
  SQInteger continuetrg;
  longlong local_d0;
  SQUnsignedInteger local_c8;
  SQInteger __ncontinues__;
  SQInteger __nbreaks__;
  long local_a8;
  SQInteger i;
  SQInstructionVec exp;
  SQInteger expsize;
  SQInteger expend;
  SQInteger expstart;
  long local_50;
  SQInteger jzpos;
  SQInteger jmppos;
  SQScope __oldscope__;
  SQCompiler *this_local;
  
  Lex(this);
  SVar1 = (this->_scope).outers;
  SVar2 = (this->_scope).stacksize;
  (this->_scope).outers = this->_fs->_outers;
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  (this->_scope).stacksize = SVar5;
  Expect(this,0x28);
  if (this->_token == 0x11b) {
    LocalDeclStatement(this);
  }
  else if (this->_token != 0x3b) {
    CommaExpr(this);
    SQFuncState::PopTarget(this->_fs);
  }
  Expect(this,0x3b);
  SQFuncState::SnoozeOpt(this->_fs);
  SVar5 = SQFuncState::GetCurrentPos(this->_fs);
  local_50 = -1;
  if (this->_token != 0x3b) {
    CommaExpr(this);
    pSVar3 = this->_fs;
    SVar6 = SQFuncState::PopTarget(this->_fs);
    SQFuncState::AddInstruction(pSVar3,_OP_JZ,SVar6,0,0,0);
    local_50 = SQFuncState::GetCurrentPos(this->_fs);
  }
  Expect(this,0x3b);
  SQFuncState::SnoozeOpt(this->_fs);
  SVar6 = SQFuncState::GetCurrentPos(this->_fs);
  if (this->_token != 0x29) {
    CommaExpr(this);
    SQFuncState::PopTarget(this->_fs);
  }
  Expect(this,0x29);
  SQFuncState::SnoozeOpt(this->_fs);
  SVar7 = SQFuncState::GetCurrentPos(this->_fs);
  exp._allocated = (SVar7 - (SVar6 + 1)) + 1;
  sqvector<SQInstruction>::sqvector((sqvector<SQInstruction> *)&i);
  if (0 < (long)exp._allocated) {
    for (local_a8 = 0; local_a8 < (long)exp._allocated; local_a8 = local_a8 + 1) {
      pSVar8 = SQFuncState::GetInstruction(this->_fs,SVar6 + 1 + local_a8);
      sqvector<SQInstruction>::push_back((sqvector<SQInstruction> *)&i,pSVar8);
    }
    SQFuncState::PopInstructions(this->_fs,exp._allocated);
  }
  __ncontinues__ = sqvector<long_long>::size(&this->_fs->_unresolvedbreaks);
  local_c8 = sqvector<long_long>::size(&this->_fs->_unresolvedcontinues);
  local_d0 = 0;
  sqvector<long_long>::push_back(&this->_fs->_breaktargets,&local_d0);
  continuetrg = 0;
  sqvector<long_long>::push_back(&this->_fs->_continuetargets,&continuetrg);
  Statement(this,true);
  SVar6 = SQFuncState::GetCurrentPos(this->_fs);
  if (0 < (long)exp._allocated) {
    for (oldouters = 0; oldouters < (long)exp._allocated; oldouters = oldouters + 1) {
      pSVar3 = this->_fs;
      pSVar8 = sqvector<SQInstruction>::operator[]((sqvector<SQInstruction> *)&i,oldouters);
      SQFuncState::AddInstruction(pSVar3,pSVar8);
    }
  }
  pSVar3 = this->_fs;
  uVar9 = SQFuncState::GetCurrentPos(pSVar3);
  SQFuncState::AddInstruction(pSVar3,_OP_JMP,0,~uVar9 + SVar5,0,0);
  if (0 < local_50) {
    pSVar3 = this->_fs;
    SVar5 = SQFuncState::GetCurrentPos(pSVar3);
    SQFuncState::SetIntructionParam(pSVar3,local_50,1,SVar5 - local_50);
  }
  lVar4 = this->_fs->_outers;
  SVar5 = SQFuncState::GetStackSize(this->_fs);
  if ((SVar5 != (this->_scope).stacksize) &&
     (SQFuncState::SetStackSize(this->_fs,(this->_scope).stacksize), lVar4 != this->_fs->_outers)) {
    SQFuncState::AddInstruction(this->_fs,_OP_CLOSE,0,(this->_scope).stacksize,0,0);
  }
  (this->_scope).outers = SVar1;
  (this->_scope).stacksize = SVar2;
  SVar10 = sqvector<long_long>::size(&this->_fs->_unresolvedbreaks);
  __ncontinues__ = SVar10 - __ncontinues__;
  SVar10 = sqvector<long_long>::size(&this->_fs->_unresolvedcontinues);
  local_c8 = SVar10 - local_c8;
  if (0 < (long)local_c8) {
    ResolveContinues(this,this->_fs,local_c8,SVar6);
  }
  if (0 < __ncontinues__) {
    ResolveBreaks(this,this->_fs,__ncontinues__);
  }
  sqvector<long_long>::pop_back(&this->_fs->_breaktargets);
  sqvector<long_long>::pop_back(&this->_fs->_continuetargets);
  sqvector<SQInstruction>::~sqvector((sqvector<SQInstruction> *)&i);
  return;
}

Assistant:

void ForStatement()
    {
        Lex();
        BEGIN_SCOPE();
        Expect(_SC('('));
        if(_token == TK_LOCAL) LocalDeclStatement();
        else if(_token != _SC(';')){
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger jmppos = _fs->GetCurrentPos();
        SQInteger jzpos = -1;
        if(_token != _SC(';')) { CommaExpr(); _fs->AddInstruction(_OP_JZ, _fs->PopTarget()); jzpos = _fs->GetCurrentPos(); }
        Expect(_SC(';'));
        _fs->SnoozeOpt();
        SQInteger expstart = _fs->GetCurrentPos() + 1;
        if(_token != _SC(')')) {
            CommaExpr();
            _fs->PopTarget();
        }
        Expect(_SC(')'));
        _fs->SnoozeOpt();
        SQInteger expend = _fs->GetCurrentPos();
        SQInteger expsize = (expend - expstart) + 1;
        SQInstructionVec exp;
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                exp.push_back(_fs->GetInstruction(expstart + i));
            _fs->PopInstructions(expsize);
        }
        BEGIN_BREAKBLE_BLOCK()
        Statement();
        SQInteger continuetrg = _fs->GetCurrentPos();
        if(expsize > 0) {
            for(SQInteger i = 0; i < expsize; i++)
                _fs->AddInstruction(exp[i]);
        }
        _fs->AddInstruction(_OP_JMP, 0, jmppos - _fs->GetCurrentPos() - 1, 0);
        if(jzpos>  0) _fs->SetIntructionParam(jzpos, 1, _fs->GetCurrentPos() - jzpos);
        END_SCOPE();

        END_BREAKBLE_BLOCK(continuetrg);
    }